

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O1

void __thiscall TxIn_Constractor_Test::TestBody(TxIn_Constractor_Test *this)

{
  AssertHelperData *pAVar1;
  pointer *ppuVar2;
  undefined8 lhs;
  _func_int **pp_Var3;
  bool bVar4;
  uint32_t uVar5;
  char *pcVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  TxIn txin;
  undefined1 local_138 [32];
  internal local_118 [8];
  _Alloc_hider local_110;
  Script local_108;
  undefined1 local_d0 [32];
  AbstractTxIn local_b0;
  
  cfd::core::TxIn::TxIn((TxIn *)&local_b0,&exp_txid,0,0xffffffff);
  local_138._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_b0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_108,"txin.GetVout()","exp_index",(uint *)local_138,&exp_index);
  if ((char)local_108._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_108.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_108.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x22,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      local_138._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTxIn::GetSequence(&local_b0);
  local_138._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_108,"txin.GetSequence()","exp_sequence",(uint *)local_138,
             &exp_sequence);
  if ((char)local_108._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_108.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_108.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x23,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      local_138._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_138,&local_b0);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_108,(Txid *)local_138);
  pp_Var3 = local_108._vptr_Script;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_d0,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_118,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",(char *)pp_Var3
             ,(char *)local_d0._0_8_);
  pAVar1 = (AssertHelperData *)(local_d0 + 0x10);
  if ((AssertHelperData *)local_d0._0_8_ != pAVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  ppuVar2 = (pointer *)
            ((long)&local_108.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8);
  if (local_108._vptr_Script != (_func_int **)ppuVar2) {
    operator_delete(local_108._vptr_Script);
  }
  local_138._0_8_ = &PTR__Txid_0068dcd8;
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._8_8_);
  }
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_110._M_p == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x24,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_108._vptr_Script != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_108._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_108._vptr_Script + 8))();
      }
      local_108._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_b0);
  cfd::core::TxIn::TxIn((TxIn *)&local_b0,&exp_txid,0,0xffffffff,&exp_script);
  uVar5 = cfd::core::AbstractTxIn::GetVout(&local_b0);
  local_138._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_108,"txin.GetVout()","exp_index",(uint *)local_138,&exp_index);
  if ((char)local_108._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_108.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_108.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x29,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      local_138._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTxIn::GetSequence(&local_b0);
  local_138._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_108,"txin.GetSequence()","exp_sequence",(uint *)local_138,
             &exp_sequence);
  if ((char)local_108._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_108.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_108.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      local_138._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_138,&local_b0);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_108,(Txid *)local_138);
  pp_Var3 = local_108._vptr_Script;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_d0,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_118,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",(char *)pp_Var3
             ,(char *)local_d0._0_8_);
  if ((AssertHelperData *)local_d0._0_8_ != pAVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (local_108._vptr_Script != (_func_int **)ppuVar2) {
    operator_delete(local_108._vptr_Script);
  }
  local_138._0_8_ = &PTR__Txid_0068dcd8;
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._8_8_);
  }
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_110._M_p == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_108._vptr_Script != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_108._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_108._vptr_Script + 8))();
      }
      local_108._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetUnlockingScript(&local_108,&local_b0);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_138,&local_108);
  lhs = local_138._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_d0,&exp_script);
  testing::internal::CmpHelperSTREQ
            (local_118,"txin.GetUnlockingScript().GetHex().c_str()","exp_script.GetHex().c_str()",
             (char *)lhs,(char *)local_d0._0_8_);
  if ((AssertHelperData *)local_d0._0_8_ != pAVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  cfd::core::Script::~Script(&local_108);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_110._M_p == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_108._vptr_Script != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_108._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_108._vptr_Script + 8))();
      }
      local_108._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_b0);
  return;
}

Assistant:

TEST(TxIn, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  }

  {
    TxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
    EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}